

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O3

void Fx_ManComputeLevel(Fx_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  uint *puVar4;
  Vec_Int_t *pVVar5;
  int *__s;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  
  uVar11 = (ulong)p->vCubes->nSize;
  if ((long)uVar11 < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                  ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  pVVar3 = p->vCubes->pArray;
  if (0 < pVVar3->nSize) {
    uVar10 = *pVVar3->pArray;
    iVar1 = p->nVars;
    pVVar5 = (Vec_Int_t *)malloc(0x10);
    iVar7 = 0x10;
    if (0xe < iVar1 - 1U) {
      iVar7 = iVar1;
    }
    pVVar5->nCap = iVar7;
    iVar12 = 0;
    if (iVar7 == 0) {
      __s = (int *)0x0;
    }
    else {
      __s = (int *)malloc((long)iVar7 << 2);
    }
    pVVar5->pArray = __s;
    pVVar5->nSize = iVar1;
    memset(__s,0,(long)iVar1 << 2);
    p->vLevels = pVVar5;
    uVar6 = 0;
    while( true ) {
      uVar2 = pVVar3[uVar6].nSize;
      if ((int)uVar2 < 1) break;
      puVar4 = (uint *)pVVar3[uVar6].pArray;
      if (uVar10 != *puVar4) {
        if (((int)uVar10 < 0) || (iVar1 <= (int)uVar10)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
        }
        __s[uVar10] = __s[uVar10] + ((int)uVar6 - iVar12);
        uVar10 = *puVar4;
        iVar12 = (int)uVar6;
      }
      iVar7 = 0;
      if (uVar2 != 1) {
        iVar7 = 0;
        uVar8 = 1;
        do {
          if ((int)puVar4[uVar8] < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf2,"int Abc_Lit2Var(int)");
          }
          uVar9 = puVar4[uVar8] >> 1;
          if (iVar1 <= (int)uVar9) goto LAB_00266902;
          if (iVar7 <= __s[uVar9]) {
            iVar7 = __s[uVar9];
          }
          uVar8 = uVar8 + 1;
        } while (uVar2 != uVar8);
      }
      if (((int)uVar10 < 0) || (iVar1 <= (int)uVar10)) break;
      if (__s[uVar10] < iVar7) {
        __s[uVar10] = iVar7;
      }
      uVar6 = uVar6 + 1;
      if (uVar11 <= uVar6) {
        return;
      }
    }
  }
LAB_00266902:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Fx_ManComputeLevel( Fx_Man_t * p )
{
    Vec_Int_t * vCube;
    int i, iVar, iFirst = 0;
    iVar = Vec_IntEntry( Vec_WecEntry(p->vCubes,0), 0 );
    p->vLevels = Vec_IntStart( p->nVars );
    Vec_WecForEachLevel( p->vCubes, vCube, i )
    {
        if ( iVar != Vec_IntEntry(vCube, 0) )
        {
            // add the number of cubes
            Vec_IntAddToEntry( p->vLevels, iVar, i - iFirst );
            iVar = Vec_IntEntry(vCube, 0);
            iFirst = i;
        }
        Vec_IntUpdateEntry( p->vLevels, iVar, Fx_ManComputeLevelCube(p, vCube) );
    }
}